

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O0

void just::temp::directory::delete_dir(string *path_)

{
  dir_t *this;
  bool bVar1;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string fp;
  undefined1 local_48 [8];
  string e;
  dir_t d;
  string *path__local;
  
  this = (dir_t *)((long)&e.field_2 + 8);
  dir_t::dir_t(this,path_);
  dir_t::next_file_abi_cxx11_((string *)local_48,this);
  while( true ) {
    bVar1 = dir_t::eod((dir_t *)((long)&e.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    path_separator_abi_cxx11_();
    std::operator+(&local_98,path_,&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   &local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    bVar1 = is_directory((string *)local_78);
    if (bVar1) {
      delete_dir((string *)local_78);
    }
    else {
      delete_file((string *)local_78);
    }
    std::__cxx11::string::~string((string *)local_78);
    dir_t::next_file_abi_cxx11_(&local_d8,(dir_t *)((long)&e.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  std::__cxx11::string::~string((string *)local_48);
  dir_t::~dir_t((dir_t *)((long)&e.field_2 + 8));
  delete_empty_dir(path_);
  return;
}

Assistant:

static void delete_dir(const std::string& path_)
      {
        {
          dir_t d(path_);
          for (std::string e = d.next_file(); !d.eod(); e = d.next_file())
          {
            const std::string fp = path_ + path_separator() + e;
            if (is_directory(fp))
            {
              delete_dir(fp);
            }
            else
            {
              delete_file(fp);
            }
          }
        }
        delete_empty_dir(path_);
      }